

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageAndSubImageTest::Check<unsigned_int,3,false,1u>
          (StorageAndSubImageTest *this)

{
  uint a;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  GLuint GVar4;
  deUint32 dVar5;
  GLenum GVar6;
  GLenum GVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  reference pvVar9;
  uint *puVar10;
  Reference *this_00;
  uint local_54;
  GLuint i;
  GLuint fbo_size_x;
  allocator<unsigned_int> local_39;
  undefined1 local_38 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> result;
  Functions *gl;
  StorageAndSubImageTest *this_local;
  
  pRVar8 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar8->_vptr_RenderContext[3])();
  result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar3);
  GVar4 = TestReferenceDataCount<3,1u>();
  std::allocator<unsigned_int>::allocator(&local_39);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,(ulong)GVar4,&local_39)
  ;
  std::allocator<unsigned_int>::~allocator(&local_39);
  (**(code **)(result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x3fc))(0xcf5,4);
  dVar5 = (**(code **)(result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 0x200))();
  glu::checkError(dVar5,"glPixelStorei has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x8e5);
  (**(code **)(result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0x3fc))(0xd05,4);
  dVar5 = (**(code **)(result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 0x200))();
  glu::checkError(dVar5,"glPixelStorei has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x8e8);
  pcVar1 = *(code **)(result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage + 0x48a);
  GVar6 = Reference::Format<3,false>();
  GVar7 = Reference::Type<unsigned_int>();
  GVar4 = TestReferenceDataSize<unsigned_int,3,1u>();
  pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,0);
  (*pcVar1)(0,0,2,1,GVar6,GVar7,GVar4,pvVar9);
  dVar5 = (**(code **)(result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 0x200))();
  glu::checkError(dVar5,"glReadPixels has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x8fd);
  local_54 = 0;
  do {
    GVar4 = TestReferenceDataCount<3,1u>();
    if (GVar4 <= local_54) {
      this_local._7_1_ = true;
LAB_01263d4b:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
      return this_local._7_1_;
    }
    this_00 = (Reference *)local_38;
    pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                        (ulong)local_54);
    a = *pvVar9;
    puVar10 = Reference::ReferenceData<unsigned_int,false>(this_00);
    bVar2 = Reference::Compare<unsigned_int>(a,puVar10[local_54]);
    if (!bVar2) {
      this_local._7_1_ = false;
      goto LAB_01263d4b;
    }
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

bool StorageAndSubImageTest::Check()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetching data. */
	std::vector<T> result(TestReferenceDataCount<S, D>());

	gl.pixelStorei(GL_UNPACK_ALIGNMENT, sizeof(T));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei has failed");

	gl.pixelStorei(GL_PACK_ALIGNMENT, sizeof(T));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei has failed");

	glw::GLuint fbo_size_x = 0;

	switch (D)
	{
	case 1:
		fbo_size_x = 2;
		break;
	case 2:
		fbo_size_x = 2 * 3;
		break;
	case 3:
		fbo_size_x = 2 * 3 * 4;
		break;
	default:
		throw 0;
	}

	gl.readnPixels(0, 0, fbo_size_x, 1, Format<S, N>(), Type<T>(), TestReferenceDataSize<T, S, D>(),
				   (glw::GLvoid*)(&result[0]));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

	/* Comparison. */
	for (glw::GLuint i = 0; i < TestReferenceDataCount<S, D>(); ++i)
	{
		if (!Compare<T>(result[i], ReferenceData<T, N>()[i]))
		{
			return false;
		}
	}

	return true;
}